

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar2;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  stbi_uc *psVar17;
  stbi_uc *psVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  stbi_uc *psVar25;
  byte bVar26;
  int out_n;
  uint uVar27;
  stbi__uint16 *tc_00;
  ulong uVar28;
  stbi__png *z_00;
  stbi__uint32 raw_len_00;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  size_t local_4a8;
  stbi_uc tc [3];
  stbi__uint32 raw_len;
  ulong local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  psVar18 = s->buffer_start;
  psVar19 = s->buffer_start + 1;
  bVar4 = true;
  bVar8 = 0;
  uVar13 = 0;
  bVar5 = false;
  local_4d0 = 0;
  local_4a8 = 0;
  local_4e0 = 0;
  bVar6 = false;
  bVar26 = 0;
  do {
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    uVar23 = iVar9 * 0x10000 + uVar10;
    uVar11 = stbi__get16be(s);
    uVar12 = stbi__get16be(s);
    uVar30 = uVar11 << 0x10 | uVar12;
    uVar15 = (uint)local_4d0;
    uVar22 = (uint)local_4e0;
    if ((int)uVar30 < 0x49484452) {
      if (uVar30 == 0x43674249) {
        bVar5 = true;
      }
      else {
        if (uVar30 == 0x49444154) {
          if (bVar4) goto LAB_00168c51;
          if ((bVar26 != 0) && (uVar15 == 0)) {
            stbi__g_failure_reason = "no PLTE";
            return 0;
          }
          if (scan == 2) {
            s->img_n = (uint)bVar26;
            return 1;
          }
          uVar10 = uVar23 + uVar22;
          if ((int)uVar10 < (int)uVar22) {
            return 0;
          }
          if ((uint)local_4a8 < uVar10) {
            sVar20 = 0x1000;
            if (0x1000 < uVar23) {
              sVar20 = (ulong)uVar23;
            }
            if ((uint)local_4a8 != 0) {
              sVar20 = local_4a8;
            }
            do {
              local_4a8 = sVar20;
              sVar20 = (ulong)((uint)local_4a8 * 2);
            } while ((uint)local_4a8 < uVar10);
            psVar17 = (stbi_uc *)realloc(*ppsVar1,local_4a8);
            if (psVar17 == (stbi_uc *)0x0) goto LAB_0016918a;
            *ppsVar1 = psVar17;
          }
          else {
            psVar17 = *ppsVar1;
          }
          iVar9 = stbi__getn(s,psVar17 + local_4e0,uVar23);
          bVar4 = false;
          uVar22 = uVar10;
          if (iVar9 == 0) {
            stbi__g_failure_reason = "outofdata";
            return 0;
          }
          goto LAB_001688ea;
        }
        if (uVar30 == 0x49454e44) {
          if (bVar4) goto LAB_00168c51;
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar18 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,uVar22,raw_len,(int *)&raw_len,(uint)!bVar5);
          z->expanded = psVar18;
          if (psVar18 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          raw_len_00 = raw_len;
          z->idata = (stbi_uc *)0x0;
          iVar9 = s->img_n + 1;
          iVar14 = s->img_n;
          if (bVar6) {
            iVar14 = iVar9;
          }
          out_n = iVar14;
          if (req_comp != 3) {
            out_n = iVar9;
          }
          if (bVar26 != 0) {
            out_n = iVar14;
          }
          if (iVar9 != req_comp) {
            out_n = iVar14;
          }
          s->img_out_n = out_n;
          psVar18 = z->expanded;
          local_458 = (ulong)(uint)z->depth;
          x = z->s->img_x;
          y = z->s->img_y;
          if (bVar8 == 0) {
            iVar9 = stbi__create_png_image_raw(z,psVar18,raw_len,out_n,x,y,z->depth,uVar13);
            if (iVar9 == 0) {
              return 0;
            }
          }
          else {
            psVar19 = (stbi_uc *)malloc((ulong)(x * out_n * y));
            sVar20 = (size_t)out_n;
            lVar24 = 0;
            do {
              psVar3 = z->s;
              uVar23 = (&DAT_0018fef0)[lVar24];
              uVar22 = (&DAT_0018ff30)[lVar24];
              uVar27 = ~uVar23 + psVar3->img_x + uVar22;
              uVar12 = uVar27 / uVar22;
              uVar10 = (&DAT_0018ff10)[lVar24];
              uVar11 = (&DAT_0018ff50)[lVar24];
              uVar30 = ~uVar10 + psVar3->img_y + uVar11;
              uVar15 = uVar30 / uVar11;
              if ((uVar22 <= uVar27) && (uVar11 <= uVar30)) {
                iVar14 = (int)local_458;
                iVar9 = psVar3->img_n;
                iVar16 = stbi__create_png_image_raw
                                   (z,psVar18,raw_len_00,out_n,uVar12,uVar15,iVar14,uVar13);
                if (iVar16 == 0) {
                  free(psVar19);
                  return 0;
                }
                if (0 < (int)uVar15) {
                  iVar16 = uVar10 * out_n;
                  local_4d8 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      psVar17 = z->out;
                      psVar25 = psVar19 + (ulong)(z->s->img_x * iVar16) + (long)(int)uVar23 * sVar20
                      ;
                      lVar29 = 0;
                      do {
                        memcpy(psVar25,psVar17 + (lVar29 + local_4d8 * (long)(int)uVar12) * sVar20,
                               sVar20);
                        lVar29 = lVar29 + 1;
                        psVar25 = psVar25 + (long)(int)uVar22 * sVar20;
                      } while (lVar29 < (int)uVar12);
                    }
                    local_4d8 = local_4d8 + 1;
                    iVar16 = iVar16 + uVar11 * out_n;
                  } while (local_4d8 < uVar15);
                }
                uVar15 = (((int)(uVar12 * iVar14 * iVar9 + 7) >> 3) + 1) * uVar15;
                free(z->out);
                psVar18 = psVar18 + uVar15;
                raw_len_00 = raw_len_00 - uVar15;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 7);
            z->out = psVar19;
          }
          if (bVar6) {
            z_00 = (stbi__png *)(ulong)z->s->img_x;
            tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
            iVar9 = (int)z->out;
            if (z->depth == 0x10) {
              stbi__compute_transparency16(z_00,tc_00,iVar9);
            }
            else {
              stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar9);
            }
          }
          if (((bVar5) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            stbi__de_iphone((stbi__png *)z->s);
          }
          if (bVar26 != 0) {
            s->img_n = (uint)bVar26;
            uVar13 = (uint)bVar26;
            if (2 < req_comp) {
              uVar13 = req_comp;
            }
            s->img_out_n = uVar13;
            psVar18 = z->out;
            uVar23 = z->s->img_y * z->s->img_x;
            psVar19 = (stbi_uc *)malloc((ulong)(uVar23 * uVar13));
            if (psVar19 == (stbi_uc *)0x0) {
LAB_0016918a:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            if (uVar13 == 3) {
              if (uVar23 != 0) {
                uVar31 = 0;
                psVar17 = psVar19;
                do {
                  uVar28 = (ulong)psVar18[uVar31];
                  *psVar17 = palette[uVar28 * 4];
                  psVar17[1] = palette[uVar28 * 4 + 1];
                  psVar17[2] = palette[uVar28 * 4 + 2];
                  psVar17 = psVar17 + 3;
                  uVar31 = uVar31 + 1;
                } while (uVar23 != uVar31);
              }
            }
            else if (uVar23 != 0) {
              uVar31 = 0;
              do {
                *(undefined4 *)(psVar19 + uVar31 * 4) =
                     *(undefined4 *)(palette + (ulong)psVar18[uVar31] * 4);
                uVar31 = uVar31 + 1;
              } while (uVar23 != uVar31);
            }
            free(psVar18);
            z->out = psVar19;
          }
          free(z->expanded);
          z->expanded = (stbi_uc *)0x0;
          return 1;
        }
LAB_001688bd:
        if (bVar4) {
LAB_00168c51:
          stbi__g_failure_reason = "first not IHDR";
          return 0;
        }
        bVar4 = false;
        if ((uVar11 >> 0xd & 1) == 0) {
          stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar11;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar12 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar12;
          return 0;
        }
      }
      stbi__skip(s,uVar23);
    }
    else if (uVar30 == 0x74524e53) {
      if (bVar4) goto LAB_00168c51;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        stbi__g_failure_reason = "tRNS after IDAT";
        return 0;
      }
      if (bVar26 == 0) {
        uVar10 = s->img_n;
        if ((uVar10 & 1) == 0) {
          stbi__g_failure_reason = "tRNS with alpha";
          return 0;
        }
        if (uVar10 * 2 != uVar23) {
LAB_00168ccd:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar10) {
            lVar24 = 0;
            do {
              iVar9 = stbi__get16be(s);
              tc16[lVar24] = (stbi__uint16)iVar9;
              lVar24 = lVar24 + 1;
            } while (lVar24 < s->img_n);
          }
        }
        else if (0 < (int)uVar10) {
          lVar24 = 0;
          do {
            iVar9 = stbi__get16be(s);
            tc[lVar24] = ""[z->depth] * (char)iVar9;
            lVar24 = lVar24 + 1;
          } while (lVar24 < s->img_n);
        }
        bVar6 = true;
        bVar4 = false;
        bVar26 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar15 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar15 < uVar23) goto LAB_00168ccd;
        bVar26 = 4;
        bVar4 = false;
        if (uVar23 != 0) {
          psVar17 = s->img_buffer;
          psVar25 = s->img_buffer_end;
          uVar31 = 0;
          do {
            if (psVar17 < psVar25) {
              s->img_buffer = psVar17 + 1;
              bVar21 = *psVar17;
              psVar17 = psVar17 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar21 = 0;
            }
            else {
              iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
              if (iVar14 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar21 = 0;
                psVar25 = psVar19;
              }
              else {
                bVar21 = *psVar18;
                psVar25 = psVar18 + iVar14;
              }
              s->img_buffer_end = psVar25;
              s->img_buffer = psVar19;
              psVar17 = psVar19;
            }
            palette[uVar31 * 4 + 3] = bVar21;
            uVar31 = uVar31 + 1;
          } while (uVar10 + iVar9 * 0x10000 != uVar31);
        }
      }
    }
    else if (uVar30 == 0x504c5445) {
      if (bVar4) goto LAB_00168c51;
      if ((0x300 < uVar23) ||
         (uVar11 = uVar10 * 0xaaab >> 0x11, local_4d0 = (ulong)uVar11, uVar11 * 3 != uVar23)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      bVar4 = false;
      if (2 < uVar10) {
        psVar17 = s->img_buffer;
        psVar25 = s->img_buffer_end;
        uVar31 = 0;
        do {
          if (psVar17 < psVar25) {
            s->img_buffer = psVar17 + 1;
            bVar21 = *psVar17;
            psVar17 = psVar17 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar21 = 0;
          }
          else {
            iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar9 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar21 = 0;
              psVar25 = psVar19;
            }
            else {
              bVar21 = *psVar18;
              psVar25 = psVar18 + iVar9;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar19;
            psVar17 = psVar19;
          }
          palette[uVar31 * 4] = bVar21;
          if (psVar17 < psVar25) {
            s->img_buffer = psVar17 + 1;
            bVar21 = *psVar17;
            psVar17 = psVar17 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar21 = 0;
          }
          else {
            iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar9 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar21 = 0;
              psVar25 = psVar19;
            }
            else {
              bVar21 = *psVar18;
              psVar25 = psVar18 + iVar9;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar19;
            psVar17 = psVar19;
          }
          palette[uVar31 * 4 + 1] = bVar21;
          if (psVar17 < psVar25) {
            s->img_buffer = psVar17 + 1;
            bVar21 = *psVar17;
            psVar17 = psVar17 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar21 = 0;
          }
          else {
            iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar9 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar21 = 0;
              psVar25 = psVar19;
            }
            else {
              bVar21 = *psVar18;
              psVar25 = psVar18 + iVar9;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar19;
            psVar17 = psVar19;
          }
          palette[uVar31 * 4 + 2] = bVar21;
          palette[uVar31 * 4 + 3] = 0xff;
          uVar31 = uVar31 + 1;
        } while (local_4d0 != uVar31);
      }
    }
    else {
      if (uVar30 != 0x49484452) goto LAB_001688bd;
      if (!bVar4) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (uVar23 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      iVar9 = stbi__get16be(s);
      uVar13 = stbi__get16be(s);
      uVar13 = uVar13 | iVar9 << 0x10;
      s->img_x = uVar13;
      if (0x1000000 < uVar13) {
LAB_00168c25:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      iVar9 = stbi__get16be(s);
      uVar13 = stbi__get16be(s);
      uVar13 = uVar13 | iVar9 << 0x10;
      s->img_y = uVar13;
      if (0x1000000 < uVar13) goto LAB_00168c25;
      pbVar2 = s->img_buffer;
      psVar17 = s->img_buffer_end;
      if (pbVar2 < psVar17) {
        s->img_buffer = pbVar2 + 1;
        bVar8 = *pbVar2;
        psVar25 = pbVar2 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) {
          z->depth = 0;
          goto LAB_00168d2c;
        }
        iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
        if (iVar9 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar8 = 0;
          psVar17 = psVar19;
        }
        else {
          bVar8 = *psVar18;
          psVar17 = psVar18 + iVar9;
        }
        s->img_buffer_end = psVar17;
        s->img_buffer = psVar19;
        psVar25 = psVar19;
      }
      z->depth = (uint)bVar8;
      if ((0x10 < bVar8) || ((0x10116U >> (bVar8 & 0x1f) & 1) == 0)) {
LAB_00168d2c:
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      if (psVar25 < psVar17) {
        s->img_buffer = psVar25 + 1;
        uVar13 = (uint)*psVar25;
        psVar25 = psVar25 + 1;
LAB_00168ab5:
        bVar21 = (byte)uVar13;
        if (6 < bVar21) {
LAB_00168c40:
          stbi__g_failure_reason = "bad ctype";
          return 0;
        }
        if (bVar21 == 3) {
          if (z->depth == 0x10) goto LAB_00168c40;
          uVar13 = 3;
          bVar21 = 3;
          bVar26 = 3;
        }
        else if ((uVar13 & 1) != 0) goto LAB_00168c40;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
          if (iVar9 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            uVar13 = 0;
            psVar17 = psVar19;
          }
          else {
            uVar13 = (uint)*psVar18;
            psVar17 = psVar18 + iVar9;
          }
          s->img_buffer_end = psVar17;
          s->img_buffer = psVar19;
          psVar25 = psVar19;
          goto LAB_00168ab5;
        }
        bVar21 = 0;
        uVar13 = 0;
      }
      if (psVar25 < psVar17) {
        s->img_buffer = psVar25 + 1;
        bVar8 = *psVar25;
LAB_00168b50:
        if (bVar8 != 0) {
          stbi__g_failure_reason = "bad comp method";
          return 0;
        }
      }
      else if (s->read_from_callbacks != 0) {
        iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
        if (iVar9 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar8 = 0;
          psVar17 = psVar19;
        }
        else {
          bVar8 = *psVar18;
          psVar17 = psVar18 + iVar9;
        }
        s->img_buffer_end = psVar17;
        s->img_buffer = psVar19;
        goto LAB_00168b50;
      }
      sVar7 = stbi__get8(s);
      if (sVar7 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar8 = stbi__get8(s);
      if (1 < bVar8) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar23 = s->img_x;
      if ((uVar23 == 0) || (uVar10 = s->img_y, uVar10 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      if (bVar26 == 0) {
        uVar11 = (uint)(3 < bVar21) + (uVar13 & 2) + 1;
        s->img_n = uVar11;
        if ((uint)((0x40000000 / (ulong)uVar23) / (ulong)uVar11) < uVar10) goto LAB_00168c25;
        bVar4 = false;
        bVar26 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar4 = false;
        if ((uint)(0x40000000 / (ulong)uVar23 >> 2) < uVar10) goto LAB_00168c25;
      }
    }
LAB_001688ea:
    stbi__get16be(s);
    stbi__get16be(s);
    local_4e0 = (ulong)uVar22;
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
			if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}